

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prscomp.c
# Opt level: O2

void prscode(prscxdef *ctx,int markcomp)

{
  ushort *puVar1;
  ushort *puVar2;
  uchar uVar3;
  ushort uVar4;
  ushort uVar5;
  ushort uVar6;
  mcmcxdef *pmVar7;
  toktdef *ptVar8;
  _func_void_toktdef_ptr_char_ptr_int_int_int_int *p_Var9;
  lindef *plVar10;
  emtcxdef *peVar11;
  uint16_t tmp;
  prpnum pVar12;
  uint uVar13;
  int iVar14;
  uint uVar15;
  uint uVar16;
  int iVar17;
  char *__ptr;
  uchar *puVar18;
  size_t sVar19;
  uchar *puVar20;
  toktldef *lcltab;
  lindef **pplVar21;
  uint16_t tmp_2;
  size_t sVar22;
  long lVar23;
  uint16_t tmp_1;
  ulong uVar24;
  uint uVar25;
  uchar *puVar26;
  char *pcVar27;
  tokdef *ptVar28;
  tokcxdef *ptVar29;
  ulong uVar30;
  tokdef *ptVar31;
  uint uVar32;
  uchar *puVar33;
  ulong uVar34;
  byte bVar35;
  ulong uStackY_270;
  int varargs;
  ushort local_246;
  uint curfr;
  uint local_240;
  uint local_23c;
  int local_238;
  int local_234;
  uchar *local_230;
  toktdef *local_228;
  tokdef tok;
  int parms;
  objnum sc [64];
  
  pcVar27 = (char *)(ulong)(uint)markcomp;
  bVar35 = 0;
  ptVar29 = ctx->prscxtok;
  uVar25 = (ptVar29->tokcxcur).toktyp;
  if (uVar25 == 1) {
    return;
  }
  if (uVar25 != 0x5b) {
    if (uVar25 == 0x57) {
      iVar14 = toknext(ptVar29);
      if (iVar14 != 0x36) {
LAB_0011bc64:
        errsigf(ctx->prscxerr,"TADS",0x153);
      }
      uVar4 = (ctx->prscxtok->tokcxcur).tokofs;
      iVar14 = toknext(ctx->prscxtok);
      if (iVar14 != 0x36) goto LAB_0011bc64;
      uVar6 = (ctx->prscxtok->tokcxcur).tokofs;
      iVar14 = toknext(ctx->prscxtok);
      if (iVar14 != 0x36) goto LAB_0011bc64;
      puVar18 = ctx->prscxpool + uVar4;
      puVar33 = ctx->prscxpool + uVar6;
      uVar4 = (ctx->prscxtok->tokcxcur).tokofs;
      prsnreq(ctx,0x3e);
      uVar25 = (uint)*(ushort *)puVar18;
      uVar13 = (uint)*(ushort *)(ctx->prscxpool + uVar4) + *(ushort *)puVar33 + uVar25;
      puVar20 = (uchar *)ctx->prscxcpp;
      if (puVar20 == (uchar *)0x0) {
        sVar22 = ctx->prscxcps;
      }
      else {
        sVar22 = ctx->prscxcps;
        uVar24 = (ulong)ctx->prscxcpf;
        if ((ulong)uVar13 <= sVar22 - uVar24) goto LAB_0011b37a;
      }
      uVar24 = (ulong)((int)sVar22 + uVar13 + 0x100);
      puVar20 = mchalo(ctx->prscxerr,uVar24,"prscmpd");
      if (ctx->prscxcpp != (char *)0x0) {
        memcpy(puVar20,ctx->prscxcpp,ctx->prscxcps);
        free(ctx->prscxcpp);
      }
      ctx->prscxcpp = (char *)puVar20;
      ctx->prscxcps = uVar24;
      uVar24 = (ulong)ctx->prscxcpf;
      uVar25 = (uint)*(ushort *)puVar18;
LAB_0011b37a:
      puVar20 = puVar20 + uVar24;
      memcpy(puVar20,puVar18,(ulong)uVar25);
      uVar6 = *(ushort *)puVar18;
      memcpy(puVar20 + uVar6,puVar33,(ulong)*(ushort *)puVar33);
      memcpy(puVar20 + uVar6 + *(ushort *)puVar33,ctx->prscxpool + uVar4,
             (ulong)*(ushort *)(ctx->prscxpool + uVar4));
      ctx->prscxcpf = ctx->prscxcpf + uVar13;
      return;
    }
    if (uVar25 == 0x3e) {
LAB_0011ae28:
      toknext(ptVar29);
      return;
    }
    iVar14 = 0;
    if ((uVar25 & 0xfffffffe) == 0xce) {
      uVar13 = toknext(ptVar29);
      uVar32 = uVar25;
    }
    else {
      uVar32 = 0;
      uVar13 = uVar25;
    }
    if (uVar13 == 0x50) {
      uVar13 = toknext(ctx->prscxtok);
      iVar14 = 1;
    }
    else if (uVar13 == 0xcd) {
      if ((((char)uVar32 == -0x32) || ((uVar32 & 0xff) == 0)) &&
         (__ptr = ctx->prscxspp, __ptr != (char *)0x0)) {
        if (uVar32 == 0) {
          pcVar27 = "TADS";
          errlogf(ctx->prscxerr,"TADS",0x15e);
          __ptr = ctx->prscxspp;
        }
        free(__ptr);
        ctx->prscxspp = (char *)0x0;
        ctx->prscxsps = 0;
        ctx->prscxspf = 0;
      }
      prsspec_defp = &prsspec_defaults;
      uVar34 = 0;
      uVar24 = uVar34;
      uVar25 = 0x4f;
      while (uVar34 != 0xd) {
        uStackY_270 = (ulong)pcVar27 & 0xffffffff;
        local_23c = (uint)uVar24;
        do {
          pcVar27 = prsspec_defp;
          if ((int)uVar24 == 0) {
            iVar14 = toknext(ctx->prscxtok);
            if (iVar14 == 0x36) {
              uVar24 = (ulong)(ctx->prscxtok->tokcxcur).tokofs;
              sVar19 = (ulong)*(ushort *)(ctx->prscxpool + uVar24) - 2;
              puVar20 = ctx->prscxpool + uVar24 + 2;
              uStackY_270 = 0x36;
              goto LAB_0011b0f8;
            }
            if (iVar14 != 0x4d) {
LAB_0011bc4f:
              errsigf(ctx->prscxerr,"TADS",0x157);
            }
            if (uVar32 != 0xcf) {
              errsigf(ctx->prscxerr,"TADS",0x15f);
            }
            uVar15 = toknext(ctx->prscxtok);
            uVar13 = 0;
            break;
          }
          do {
            prsspec_defp = pcVar27;
            puVar20 = *(uchar **)(prsspec_defp + 8);
            if (puVar20 == (uchar *)0x0) goto LAB_0011bc4f;
            pcVar27 = prsspec_defp + 0x10;
          } while ((int)*prsspec_defp != uVar25);
          while( true ) {
            sVar19 = strlen((char *)puVar20);
LAB_0011b0f8:
            puVar18 = (uchar *)ctx->prscxspp;
            if ((puVar18 == (uchar *)0x0) ||
               (uVar24 = (ulong)ctx->prscxspf, ctx->prscxsps - uVar24 < sVar19 + 2)) {
              local_240 = (uint)uStackY_270;
              uVar24 = (ulong)(uint)((int)sVar19 + 0x80 + (int)ctx->prscxsps);
              puVar18 = mchalo(ctx->prscxerr,uVar24,"prsspec");
              if (ctx->prscxspp != (char *)0x0) {
                memcpy(puVar18,ctx->prscxspp,ctx->prscxsps);
                free(ctx->prscxspp);
              }
              ctx->prscxspp = (char *)puVar18;
              ctx->prscxsps = uVar24;
              uVar24 = (ulong)ctx->prscxspf;
              uStackY_270 = (ulong)local_240;
            }
            uVar15 = (uint)uStackY_270;
            puVar18 = puVar18 + uVar24;
            *puVar18 = (uchar)uVar25;
            puVar18[1] = (uchar)sVar19;
            memcpy(puVar18 + 2,puVar20,sVar19);
            uVar13 = local_23c;
            ctx->prscxspf = ctx->prscxspf + (int)sVar19 + 2;
            uVar24 = (ulong)local_23c;
            if (local_23c == 0) break;
            pcVar27 = prsspec_defp + 0x10;
            if ((int)prsspec_defp[0x10] != uVar25) goto LAB_0011b1f0;
            puVar20 = *(uchar **)(prsspec_defp + 0x18);
            prsspec_defp = prsspec_defp + 0x10;
          }
          uVar15 = toknext(ctx->prscxtok);
          pcVar27 = prsspec_defp;
LAB_0011b1f0:
          prsspec_defp = pcVar27;
          uStackY_270 = 7;
        } while (uVar15 == 7);
        uVar24 = (ulong)uVar13;
        if (uVar15 == 0x3e && uVar13 == 0) {
          uVar24 = 1;
        }
        bVar35 = prsspec_wordtypes[uVar34 + 1];
        uVar34 = uVar34 + 1;
        pcVar27 = (char *)(ulong)uVar15;
        uVar25 = (uint)bVar35;
        if (((bVar35 != 0) && (pcVar27 = (char *)(ulong)uVar15, (int)uVar24 == 0)) &&
           (pcVar27 = (char *)(ulong)uVar15, uVar25 = (uint)bVar35, uVar15 != 0x3f)) {
          prssigreq(ctx,0x3f);
        }
      }
      goto LAB_0011b8ae;
    }
    if (uVar13 != 0x38) {
      errsigf(ctx->prscxerr,"TADS",0x12d);
    }
    ptVar28 = &ctx->prscxtok->tokcxcur;
    ptVar31 = &tok;
    for (lVar23 = 0xe; lVar23 != 0; lVar23 = lVar23 + -1) {
      iVar17 = ptVar28->toklen;
      ptVar31->toktyp = ptVar28->toktyp;
      ptVar31->toklen = iVar17;
      ptVar28 = (tokdef *)((long)ptVar28 + (ulong)bVar35 * -0x10 + 8);
      ptVar31 = (tokdef *)((long)ptVar31 + (ulong)bVar35 * -0x10 + 8);
    }
    if (uVar32 == 0xcf) {
      local_238 = iVar14;
      local_234 = markcomp;
      if ((tok.toksym.tokstyp != '\x02') ||
         (ctx->prscxvoc->voccxinh[tok.toksym.toksval >> 8][(byte)tok.toksym.toksval] ==
          (vocidef *)0x0)) {
        errsigf(ctx->prscxerr,"TADS",0x15d);
      }
      pmVar7 = ctx->prscxmem;
      uVar4 = pmVar7->mcmcxgl->mcmcxtab
              [*(byte *)((long)pmVar7->mcmcxmtb[tok.toksym.toksval >> 8] +
                        (ulong)(tok.toksym.toksval & 0xff) * 2 + 1)]
              [(byte)pmVar7->mcmcxmtb[tok.toksym.toksval >> 8][tok.toksym.toksval & 0xff]].mcmosiz;
      puVar20 = mcmalo0(pmVar7,uVar4,(mcmon *)&varargs,0xffff,0);
      puVar18 = mcmlck(ctx->prscxmem,tok.toksym.toksval);
      memcpy(puVar20,puVar18,(ulong)uVar4);
      local_246 = *(ushort *)(puVar20 + 2);
      *(ushort *)(puVar20 + 2) = local_246 | 5;
      uVar4 = ctx->prscxmem->mcmcxmtb[(ushort)varargs >> 8][varargs & 0xff];
      puVar2 = (ushort *)
               ((long)&ctx->prscxmem->mcmcxgl->mcmcxtab[uVar4 >> 8]->mcmoflg +
               (ulong)((uVar4 & 0xff) << 5));
      *puVar2 = *puVar2 | 1;
      mcmunlck(ctx->prscxmem,tok.toksym.toksval);
      mcmunlck(ctx->prscxmem,(ushort)varargs);
      uVar25 = 0x22;
      if (tok.toksym.tokslen < 0x22) {
        uVar25 = (uint)tok.toksym.tokslen;
      }
      sprintf((char *)&parms,"%.*s@%d",(ulong)uVar25,tok.toksym.toksnam,(ulong)(ushort)varargs);
      ptVar8 = ctx->prscxstab;
      p_Var9 = ptVar8->toktfadd;
      sVar19 = strlen((char *)&parms);
      iVar14 = varargs;
      uVar16 = tokhsh((char *)&parms);
      (*p_Var9)(ptVar8,(char *)&parms,(int)sVar19,2,(int)iVar14,uVar16);
      sc[0] = (ushort)varargs;
      vociren(ctx->prscxvoc,tok.toksym.toksval,(ushort)varargs);
      markcomp = local_234;
      iVar14 = local_238;
      pplVar21 = &ctx->prscxvoc->voccxrun->runcxdbg->dbgcxlin;
      while (plVar10 = *pplVar21, plVar10 != (lindef *)0x0) {
        (*plVar10->linrenp)(plVar10,tok.toksym.toksval,(ushort)varargs);
        pplVar21 = &plVar10->linnxt;
      }
      iVar17 = 1;
      if ((local_246 & 1) != 0) {
        iVar14 = iVar17;
      }
      toknext(ctx->prscxtok);
    }
    else {
      prsnreq(ctx,0x34);
      iVar17 = (ctx->prscxtok->tokcxcur).toktyp;
      if (iVar17 == 0x5a) {
        if (uVar32 != 0) {
          errlogf(ctx->prscxerr,"TADS",0x15a);
        }
        prsnreq(ctx,0x46);
        prsreq(ctx,0x3e);
        prsdef(ctx,&tok,10);
        if (tok.toksym.tokstyp == '\n') {
          return;
        }
        errsigf(ctx->prscxerr,"TADS",0x133);
      }
      if (iVar17 == 0x46) {
        prsdef(ctx,&tok,8);
        iVar14 = toknext(ctx->prscxtok);
        if (iVar14 != 0x3e) {
          if ((tok.toksym.tokstyp != '\b') && ((uVar32 != 0xce || (tok.toksym.tokstyp != '\x01'))))
          {
            errlogf(ctx->prscxerr,"TADS",0x146);
            tok.toksym.tokstyp = '\0';
            (*ctx->prscxstab->toktfset)(ctx->prscxstab,&tok.toksym);
            prsdef(ctx,&tok,8);
          }
          tok.toksym.tokstyp = '\x01';
          (*ctx->prscxstab->toktfset)(ctx->prscxstab,&tok.toksym);
          local_230 = ctx->prscxplcl;
          local_228 = ctx->prscxtok->tokcxstab;
          uVar5 = ctx->prscxslcl;
          varargs = 0;
          parms = 0;
          curfr = 0;
          if (iVar14 == 0x32) {
            lcltab = prsvlst(ctx,(toktldef *)0x0,(prsndef **)0x0,&parms,1,&varargs,0);
            prsreq(ctx,0x33);
          }
          else {
            lcltab = (toktldef *)0x0;
          }
          if (uVar32 == 0xce) {
            pplVar21 = &ctx->prscxvoc->voccxrun->runcxdbg->dbgcxlin;
            while (plVar10 = *pplVar21, plVar10 != (lindef *)0x0) {
              (*plVar10->lindelp)(plVar10,tok.toksym.toksval);
              pplVar21 = &plVar10->linnxt;
            }
          }
          puVar20 = mcmlck(ctx->prscxmem,tok.toksym.toksval);
          ctx->prscxemt->emtcxptr = puVar20;
          ctx->prscxemt->emtcxofs = 0;
          ctx->prscxemt->emtcxobj = tok.toksym.toksval;
          uVar4 = (ushort)*(undefined4 *)&ctx->prscxflg;
          ctx->prscxflg = uVar4 | 0x40;
          sc._8_4_ = _setjmp((__jmp_buf_tag *)(sc + 0x38));
          if (sc._8_4_ != 0) {
            ctx->prscxerr->errcxptr = (errdef *)sc._0_8_;
            ctx->prscxplcl = local_230;
            ctx->prscxslcl = uVar5;
            ctx->prscxtok->tokcxstab = local_228;
            ctx->prscxflg = uVar4;
            prsdelgoto(ctx);
            mcmunlck(ctx->prscxmem,tok.toksym.toksval);
            errrse1(ctx->prscxerr,(errdef *)sc);
          }
          sc._0_8_ = ctx->prscxerr->errcxptr;
          ctx->prscxerr->errcxptr = (errdef *)sc;
          if ((ctx->prscxflg & 8) != 0) {
            emtres(ctx->prscxemt,1);
            peVar11 = ctx->prscxemt;
            uVar6 = peVar11->emtcxofs;
            peVar11->emtcxofs = uVar6 + 1;
            peVar11->emtcxptr[uVar6] = 'M';
            emtres(ctx->prscxemt,1);
            peVar11 = ctx->prscxemt;
            uVar6 = peVar11->emtcxofs;
            peVar11->emtcxofs = uVar6 + 1;
            peVar11->emtcxptr[uVar6] = (varargs != 0) * -0x80 + (char)parms;
          }
          if (lcltab != (toktldef *)0x0) {
            prsvgfr(ctx,lcltab,&curfr);
          }
          if ((ctx->prscxtok->tokcxcur).toktyp == 0x3c) {
            prsstm(ctx,0xffff,0xffff,parms,0,0,(prscsdef *)0x0,curfr);
            emtres(ctx->prscxemt,1);
            peVar11 = ctx->prscxemt;
            uVar6 = peVar11->emtcxofs;
            peVar11->emtcxofs = uVar6 + 1;
            peVar11->emtcxptr[uVar6] = '\x16';
            emtres(ctx->prscxemt,2);
            puVar20 = ctx->prscxemt->emtcxptr + ctx->prscxemt->emtcxofs;
            puVar20[0] = '\0';
            puVar20[1] = '\0';
            puVar1 = &ctx->prscxemt->emtcxofs;
            *puVar1 = *puVar1 + 2;
            ctx->prscxplcl = local_230;
            ctx->prscxslcl = uVar5;
            mcmrealo(ctx->prscxmem,tok.toksym.toksval,ctx->prscxemt->emtcxofs);
            pmVar7 = ctx->prscxmem;
            puVar1 = &pmVar7->mcmcxgl->mcmcxtab
                      [*(byte *)((long)pmVar7->mcmcxmtb[tok.toksym.toksval >> 8] +
                                (ulong)(tok.toksym.toksval & 0xff) * 2 + 1)]
                      [(byte)pmVar7->mcmcxmtb[tok.toksym.toksval >> 8][tok.toksym.toksval & 0xff]].
                      mcmoflg;
            *puVar1 = *puVar1 | 1;
            mcmunlck(ctx->prscxmem,tok.toksym.toksval);
            ctx->prscxemt->emtcxptr = (uchar *)0x0;
            ctx->prscxtok->tokcxstab = local_228;
            ctx->prscxflg = uVar4;
            prsdelgoto(ctx);
            ctx->prscxerr->errcxptr = (errdef *)sc._0_8_;
            return;
          }
          prssigreq(ctx,0x3c);
        }
        if (uVar32 != 0) {
          errlogf(ctx->prscxerr,"TADS",0x15c);
        }
        if ((tok.toksym.tokstyp != '\b') && (tok.toksym.tokstyp != '\x01')) {
          errsigf(ctx->prscxerr,"TADS",0x134);
        }
        ptVar29 = ctx->prscxtok;
        goto LAB_0011ae28;
      }
      if (iVar17 == 0x49) {
        toknext(ctx->prscxtok);
        iVar17 = 0;
      }
      else {
        if (iVar17 != 0x38) {
          errsigf(ctx->prscxerr,"TADS",0x142);
        }
        lVar23 = 0;
        while( true ) {
          if ((int)lVar23 == 0x40) {
            errsigf(ctx->prscxerr,"TADS",0x14b);
          }
          prsdef(ctx,&ctx->prscxtok->tokcxcur,7);
          ptVar29 = ctx->prscxtok;
          uVar3 = (ptVar29->tokcxcur).toksym.tokstyp;
          if ((uVar3 != '\x02') && (uVar3 != '\a')) {
            errsigf(ctx->prscxerr,"TADS",0x132);
          }
          sc[lVar23] = (ptVar29->tokcxcur).toksym.toksval;
          iVar17 = toknext(ptVar29);
          if (iVar17 != 0x3f) break;
          toknext(ctx->prscxtok);
          lVar23 = lVar23 + 1;
        }
        iVar17 = (int)lVar23 + 1;
      }
    }
    prsdef(ctx,&tok,7);
    if ((tok.toksym.tokstyp != '\a') && ((uVar32 == 0 || (tok.toksym.tokstyp != '\x02')))) {
      errlogf(ctx->prscxerr,"TADS",0x14c);
      tok.toksym.tokstyp = '\0';
      prsdefobj(ctx,&tok,7);
    }
    if ((uVar32 == 0xce) && (tok.toksym.tokstyp == '\x02')) {
      vocidel(ctx->prscxvoc,tok.toksym.toksval);
      vocdel(ctx->prscxvoc,tok.toksym.toksval);
    }
    tok.toksym.tokstyp = '\x02';
    (*ctx->prscxstab->toktfset)(ctx->prscxstab,&tok.toksym);
    prsobj(ctx,&tok,iVar17,sc,iVar14);
    if (markcomp != 0) {
      objcomp(ctx->prscxmem,tok.toksym.toksval,ctx->prscxflg & 1);
    }
    goto LAB_0011b8ae;
  }
  iVar14 = toknext(ptVar29);
  if (iVar14 != 0x36) {
    errsigf(ctx->prscxerr,"TADS",0x154);
  }
  uVar24 = (ulong)(ctx->prscxtok->tokcxcur).tokofs;
  puVar33 = ctx->prscxpool + uVar24;
  sVar19 = (size_t)*(ushort *)puVar33;
  puVar18 = ctx->prscxpool + uVar24 + 2;
  uVar24 = sVar19 - 2;
  puVar20 = puVar18;
  for (uVar34 = 0; uVar34 < uVar24; uVar34 = uVar34 + uVar30 + 1) {
    uVar30 = (ulong)(*puVar20 == '\\');
    sVar19 = sVar19 - uVar30;
    puVar26 = puVar20 + uVar30;
    puVar20 = puVar26 + 1;
    *puVar18 = *puVar26;
    puVar18 = puVar18 + 1;
  }
  *(ushort *)puVar33 = (ushort)sVar19;
  toknext(ctx->prscxtok);
  pVar12 = prsrqpr(ctx);
  puVar20 = ctx->prscxfsp;
  if (puVar20 == (uchar *)0x0) {
    sVar22 = ctx->prscxfss;
LAB_0011b2a0:
    uVar24 = (ulong)((int)sVar19 + (int)sVar22 + 0x100);
    puVar20 = mchalo(ctx->prscxerr,uVar24,"prsfmt");
    if (ctx->prscxfsp != (uchar *)0x0) {
      memcpy(puVar20,ctx->prscxfsp,ctx->prscxfss);
      free(ctx->prscxfsp);
    }
    ctx->prscxfsp = puVar20;
    ctx->prscxfss = uVar24;
    uVar24 = (ulong)ctx->prscxfsf;
  }
  else {
    sVar22 = ctx->prscxfss;
    uVar24 = (ulong)ctx->prscxfsf;
    if (sVar22 - uVar24 < sVar19 + 2) goto LAB_0011b2a0;
  }
  *(prpnum *)(puVar20 + uVar24) = pVar12;
  memcpy((prpnum *)((long)(puVar20 + uVar24) + 2),puVar33,sVar19);
  ctx->prscxfsf = ctx->prscxfsf + (int)sVar19 + 2;
LAB_0011b8ae:
  prsreq(ctx,0x3e);
  return;
}

Assistant:

void prscode(prscxdef *ctx, int markcomp)
{
    int           t;
    noreg tokdef  tok;
    int           parms;
    uchar        *oldplcl;
    uint          oldslcl;
    int           numsc = 0;           /* number of superclasses for object */
    objnum        sc[PRSMAXSC];           /* superclasses of current object */
    objnum       *scp;
    int           classflg = 0;  /* VOCIFCLASS ==> object is a class object */
    toktdef      *oldltab;
    int           varargs;
    uint          curfr;
    toktldef     *ltab;
    int           oldflg;
    int           modflag = 0;                      /* modify/replace flags */
    
    NOREG((&tok))
    
    t = ctx->prscxtok->tokcxcur.toktyp;
    if (t == TOKTEOF) return;            /* end of file; nothing more to do */
    
    /* allow null statements */
    if (t == TOKTSEM)
    {
        toknext(ctx->prscxtok);
        return;
    }

    /* check for special "compound word" construction */
    if (t == TOKTCOMPOUND)
    {
        prscmpd(ctx);
        return;
    }
    
    /* check for special formatString construct */
    if (t == TOKTFORMAT)
    {
        prsfmt(ctx);
        return;
    }
    
    /* check for 'replace' or 'modify' keywords */
    if (t == TOKTREPLACE || t == TOKTMODIFY)
    {
        modflag = t;
        t = toknext(ctx->prscxtok);
    }

    /* check for specialWords construct */
    if (t == TOKTSPECIAL)
    {
        prsspec(ctx, modflag);
        return;
    }

    /* check for 'class' prefix */
    if (t == TOKTCLASS)
    {
        classflg = VOCIFCLASS;
        t = toknext(ctx->prscxtok);
    }

    if (t != TOKTSYMBOL) errsig(ctx->prscxerr, ERR_REQSYM);
    OSCPYSTRUCT(tok, ctx->prscxtok->tokcxcur);

    /* 'modify <object>' skips the colon and goes directly to the body */
    if (modflag == TOKTMODIFY)
    {
        mcmon   newobj;
        uchar  *newptr;
        uchar  *oldptr;
        char    newnam[TOKNAMMAX+1];
        int     len;
        ushort  objsiz;
        lindef *lin;
        
        /* require a previously defined object */
        if (tok.toksym.tokstyp != TOKSTOBJ
            || vocinh(ctx->prscxvoc, tok.toksym.toksval) == 0)
            errsig(ctx->prscxerr, ERR_MODOBJ);

        /* create a copy of the original object */
        objsiz = mcmobjsiz(ctx->prscxmem, (mcmon)tok.toksym.toksval);
        newptr = mcmalo(ctx->prscxmem, objsiz, &newobj);
        oldptr = mcmlck(ctx->prscxmem, (mcmon)tok.toksym.toksval);
        memcpy(newptr, oldptr, (size_t)objsiz);

        /* remember whether the original object was a class */
        if (objflg(newptr) & OBJFCLASS)
            classflg = VOCIFCLASS;

        /*
         *   Set the "superseded by modified object" flag in the
         *   original.  Also set the class flag, because we want the
         *   modified version to inherit location and vocabulary. 
         */
        objsflg(newptr, objflg(newptr) | OBJFMOD | OBJFCLASS);
        mcmtch(ctx->prscxmem, (mcmon)newobj);

        /* done with the objects - unlock them */
        mcmunlck(ctx->prscxmem, (mcmon)tok.toksym.toksval);
        mcmunlck(ctx->prscxmem, newobj);

        /* create a fake symbol table entry for the original data */
        len = tok.toksym.tokslen;
        if (len > TOKNAMMAX - 5) len = TOKNAMMAX - 5;
        sprintf(newnam, "%.*s@%d", len, tok.toksym.toksnam,
                (int)newobj);
        (*ctx->prscxstab->toktfadd)(ctx->prscxstab, newnam,
                                    (int)strlen(newnam), TOKSTOBJ,
                                    (int)newobj, tokhsh(newnam));

        /* the superclass for the new object is simply the old object */
        numsc = 1;
        sc[0] = newobj;

        /* renumber the inheritance records for the old object */
        vociren(ctx->prscxvoc, tok.toksym.toksval, newobj);

        /* go through all line sources and renumber this object */
        for (lin = ctx->prscxvoc->voccxrun->runcxdbg->dbgcxlin ; lin ;
             lin = lin->linnxt)
        {
            /* renumber instances of the object in this line source */
            linrenum(lin, tok.toksym.toksval, newobj);
        }

        /* go parse the object body as normal */
        toknext(ctx->prscxtok);
        goto objbody;
    }
    
    prsnreq(ctx, TOKTCOLON);
    t = ctx->prscxtok->tokcxcur.toktyp;
    switch(t)
    {
    case TOKTEXTERN:
        if (modflag) errlog(ctx->prscxerr, ERR_MODRPLX);
        prsnreq(ctx, TOKTFUNCTION);
        prsreq(ctx, TOKTSEM);
        prsdef(ctx, (tokdef *)&tok, TOKSTEXTERN);
        if (tok.toksym.tokstyp != TOKSTEXTERN)
            errsig(ctx->prscxerr, ERR_REQEXT);
        break;
        
    case TOKTFUNCTION:
        if (modflag == TOKTMODIFY) errlog(ctx->prscxerr, ERR_MODFCN);
        prsdef(ctx, (tokdef *)&tok, TOKSTFWDFN);
        t = toknext(ctx->prscxtok);
        if (t == TOKTSEM)
        {
            if (modflag) errlog(ctx->prscxerr, ERR_MODFWD);
            if (tok.toksym.tokstyp != TOKSTFWDFN &&
                tok.toksym.tokstyp != TOKSTFUNC)
                errsig(ctx->prscxerr, ERR_REQFCN);
            toknext(ctx->prscxtok);
            break;
        }

        /* check that we're not redefining the symbol, then define as fcn */
        if (!(tok.toksym.tokstyp == TOKSTFWDFN
              || (tok.toksym.tokstyp == TOKSTFUNC && modflag == TOKTREPLACE)))
        {
            /* log the error */
            errlog(ctx->prscxerr, ERR_FREDEF);

            /* 
             *   Since the symbol was already defined as something else,
             *   we haven't given it a proper function definition yet.  In
             *   particular, we haven't assigned an object number to the
             *   function.  Do so now by forcing the symbol to undefined
             *   then defining it as a function again.
             *   
             *   Note that we need to force the change in the global
             *   symbol table itself.  This will hose down any previous
             *   definition of the symbol, but this doesn't matter much
             *   since the game is already not playable due to this error.
             */

            /* set it to unknown */
            tok.toksym.tokstyp = TOKSTUNK;

            /* force it back into the global table as unknown */
            (*ctx->prscxstab->toktfset)(ctx->prscxstab,
                                        (toksdef *)&tok.toksym);

            /* define it as a forward function to assign an object ID */
            prsdef(ctx, (tokdef *)&tok, TOKSTFWDFN);
        }

        /* 
         *   make sure the symbol is in the symbol table as a function if
         *   it's not already - it could have been a forward function, in
         *   which case it's time to make it a defined function, since
         *   this is the definition 
         */
        tok.toksym.tokstyp = TOKSTFUNC;
        (*ctx->prscxstab->toktfset)(ctx->prscxstab, (toksdef *)&tok.toksym);
        
        oldltab = ctx->prscxtok->tokcxstab;           /* remember old table */
        oldplcl = ctx->prscxplcl;                /* and old table pool data */
        oldslcl = ctx->prscxslcl;

        varargs = FALSE;
        parms = 0;
        curfr = 0;                                /* no enclosing frame yet */
        ltab = (toktldef *)0;                  /* no local symbol table yet */
        if (t == TOKTLPAR)
        {
            ltab = prsvlst(ctx, (toktldef *)0, (prsndef **)0, &parms, TRUE,
                           &varargs, curfr);
            prsreq(ctx, TOKTRPAR);
        }
        
        /*
         *   If we're replacing this function, delete any references in
         *   line number records to this object; this will prevent the
         *   debugger from attempting to use these records, which will be
         *   invalid after we replace the object's pcode with the new
         *   pcode here.  
         */
        if (modflag == TOKTREPLACE)
        {
            lindef *lin;
            for (lin = ctx->prscxvoc->voccxrun->runcxdbg->dbgcxlin ; lin ;
                 lin = lin->linnxt)
            {
                /* delete instances of the object in this line source */
                lindelnum(lin, (objnum)tok.toksym.toksval);
            }
        }

        /* set up emit context for the new object */
        ctx->prscxemt->emtcxptr = mcmlck(ctx->prscxmem,
                                         (mcmon)tok.toksym.toksval);
        ctx->prscxemt->emtcxofs = 0;
        ctx->prscxemt->emtcxobj = tok.toksym.toksval;

        /* flag that we're doing a function - no "self" */
        oldflg = ctx->prscxflg;
        ctx->prscxflg |= PRSCXFFUNC;
        
        /* now parse the body of the function */
        ERRBEGIN(ctx->prscxerr)
            
        if (ctx->prscxflg & PRSCXFARC)
        {
            emtop(ctx->prscxemt, OPCCHKARGC);
            emtbyte(ctx->prscxemt, (varargs ? 0x80 : 0 ) + parms);
        }
        
        /* if there's a local symbol table, set up debug record */
        if (ltab) prsvgfr(ctx, ltab, &curfr);
        
        if (ctx->prscxtok->tokcxcur.toktyp != TOKTLBRACE)
            prssigreq(ctx, TOKTLBRACE);
        prsstm(ctx, EMTLLNKEND, EMTLLNKEND, parms, 0, 0, (prscsdef *)0,
               curfr);
        
        /* be sure to emit a 'return' at the end of the function */
        emtop(ctx->prscxemt, OPCRETURN);
        emtint2(ctx->prscxemt, 0);
        
        /* restore local symbol table information in context */
        ctx->prscxplcl = oldplcl;
        ctx->prscxslcl = oldslcl;
        
        /* resize the object down to the actual space needed */
        mcmrealo(ctx->prscxmem, (mcmon)tok.toksym.toksval,
                 (ushort)ctx->prscxemt->emtcxofs);
        
        /* tell cache manager the object's been changed, and unlock it */
        mcmtch(ctx->prscxmem, (mcmon)tok.toksym.toksval);
        mcmunlck(ctx->prscxmem, (mcmon)tok.toksym.toksval);

        /* to prevent stray writes to this object... */
        ctx->prscxemt->emtcxptr = (uchar *)0;
        
        /* clean up context changes, and delete labels */
        ctx->prscxtok->tokcxstab = oldltab;
        ctx->prscxflg = oldflg;
        prsdelgoto(ctx);

        ERRCLEAN(ctx->prscxerr)
            ctx->prscxplcl = oldplcl;
            ctx->prscxslcl = oldslcl;
            ctx->prscxtok->tokcxstab = oldltab;
            ctx->prscxflg = oldflg;
            prsdelgoto(ctx);
            mcmunlck(ctx->prscxmem, (mcmon)tok.toksym.toksval);
        ERRENDCLN(ctx->prscxerr)
        
        break;  
        
    case TOKTSYMBOL:
        for (scp = sc ;;)
        {
            int typ;
            
            /* check that we have room for a new superclass */
            if (numsc >= PRSMAXSC) errsig(ctx->prscxerr, ERR_MANYSC);

            /* define superclass symbol as object if not already done */
            prsdef(ctx, &ctx->prscxtok->tokcxcur, TOKSTFWDOBJ);
            typ = ctx->prscxtok->tokcxcur.toksym.tokstyp;
            if (typ != TOKSTOBJ && typ != TOKSTFWDOBJ)
                errsig(ctx->prscxerr, ERR_REQOBJ);
            
            /* add the object to the superclass array */
            *scp++ = ctx->prscxtok->tokcxcur.toksym.toksval;
            ++numsc;
            
            /* skip the token, and keep going as long as the list continues */
            if (toknext(ctx->prscxtok) != TOKTCOMMA) break;
            typ = toknext(ctx->prscxtok);        /* get next object in list */
        }
        goto objbody;
        /* FALLTHROUGH */
        
    case TOKTOBJECT:
        toknext(ctx->prscxtok);
    objbody:
        prsdef(ctx, (tokdef *)&tok, TOKSTFWDOBJ);
        if (!(tok.toksym.tokstyp == TOKSTFWDOBJ
              || (tok.toksym.tokstyp == TOKSTOBJ && modflag != 0)))
        {
            /* 
             *   it's already defined globally as something other than an
             *   object - log an error 
             */
            errlog(ctx->prscxerr, ERR_OREDEF);

            /* 
             *   actually redefine the symbol as an object, so that we can
             *   proceed with the compilation 
             */
            tok.toksym.tokstyp = TOKSTUNK;
            prsdefobj(ctx, (tokdef *)&tok, TOKSTFWDOBJ);
        }

        /* if we're replacing the object, delete its vocabulary records */
        if (modflag == TOKTREPLACE && tok.toksym.tokstyp == TOKSTOBJ)
        {
            vocidel(ctx->prscxvoc, (objnum)tok.toksym.toksval);
            vocdel(ctx->prscxvoc, (objnum)tok.toksym.toksval);
        }

        /* make the symbol refer to an object now */
        tok.toksym.tokstyp = TOKSTOBJ;
        (*ctx->prscxstab->toktfset)(ctx->prscxstab, (toksdef *)&tok.toksym);

        /* compile the object */
        prsobj(ctx, &tok, numsc, sc, classflg);
        if (markcomp)
            objcomp(ctx->prscxmem, (objnum)tok.toksym.toksval,
                    (ctx->prscxflg & PRSCXFLIN) != 0);
        
        prsreq(ctx, TOKTSEM);
        break;
        
    default:
        errsig(ctx->prscxerr, ERR_SYNTAX);
    }
}